

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

Promise<void> __thiscall
capnp::_::TestInterfaceImpl::getTestTailCallee
          (TestInterfaceImpl *this,GetTestTailCalleeContext context)

{
  Own<capnp::_::TestTailCalleeImpl,_std::nullptr_t> local_a0;
  Client local_90 [2];
  Maybe<capnp::MessageSize> local_60;
  Builder local_48;
  CallContextHook *local_20;
  TestInterfaceImpl *this_local;
  GetTestTailCalleeContext context_local;
  
  local_20 = context.hook;
  context_local.hook = (CallContextHook *)this;
  kj::Maybe<capnp::MessageSize>::Maybe();
  CallContext<capnproto_test::capnp::test::TestInterface::GetTestTailCalleeParams,_capnproto_test::capnp::test::TestInterface::GetTestTailCalleeResults>
  ::getResults(&local_48,
               (CallContext<capnproto_test::capnp::test::TestInterface::GetTestTailCalleeParams,_capnproto_test::capnp::test::TestInterface::GetTestTailCalleeResults>
                *)&this_local,&local_60);
  kj::heap<capnp::_::TestTailCalleeImpl,int&>
            ((kj *)&local_a0,(int *)context.hook[1]._vptr_CallContextHook);
  capnproto_test::capnp::test::TestTailCallee::Client::Client<capnp::_::TestTailCalleeImpl,void>
            (local_90,&local_a0);
  capnproto_test::capnp::test::TestInterface::GetTestTailCalleeResults::Builder::setCap
            (&local_48,local_90);
  capnproto_test::capnp::test::TestTailCallee::Client::~Client(local_90);
  kj::Own<capnp::_::TestTailCalleeImpl,_std::nullptr_t>::~Own(&local_a0);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_60);
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestInterfaceImpl::getTestTailCallee(GetTestTailCalleeContext context) {
  context.getResults().setCap(kj::heap<TestTailCalleeImpl>(callCount));
  return kj::READY_NOW;
}